

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3_wal_autocheckpoint(sqlite3 *db,int nFrame)

{
  sqlite3_mutex *psVar1;
  
  if (nFrame < 1) {
    if (db->mutex == (sqlite3_mutex *)0x0) {
      db->xWalCallback = (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0;
      db->pWalArg = (void *)0x0;
      return 0;
    }
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar1 = db->mutex;
    db->xWalCallback = (_func_int_void_ptr_sqlite3_ptr_char_ptr_int *)0x0;
    db->pWalArg = (void *)0x0;
  }
  else {
    if (db->mutex == (sqlite3_mutex *)0x0) {
      db->xWalCallback = sqlite3WalDefaultHook;
      db->pWalArg = (void *)(ulong)(uint)nFrame;
      return 0;
    }
    (*sqlite3Config.mutex.xMutexEnter)(db->mutex);
    psVar1 = db->mutex;
    db->xWalCallback = sqlite3WalDefaultHook;
    db->pWalArg = (void *)(ulong)(uint)nFrame;
  }
  if (psVar1 != (sqlite3_mutex *)0x0) {
    (*sqlite3Config.mutex.xMutexLeave)(psVar1);
  }
  return 0;
}

Assistant:

SQLITE_API int sqlite3_wal_autocheckpoint(sqlite3 *db, int nFrame){
#ifdef SQLITE_OMIT_WAL
  UNUSED_PARAMETER(db);
  UNUSED_PARAMETER(nFrame);
#else
  if( nFrame>0 ){
    sqlite3_wal_hook(db, sqlite3WalDefaultHook, SQLITE_INT_TO_PTR(nFrame));
  }else{
    sqlite3_wal_hook(db, 0, 0);
  }
#endif
  return SQLITE_OK;
}